

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

Vec4 __thiscall glcts::BlendOverlay(glcts *this,Vec4 *src,Vec4 *dst)

{
  float *pfVar1;
  float x_;
  float y_;
  float fVar2;
  Vec4 VVar3;
  undefined1 local_30 [8];
  Vec4 rgb;
  Vec4 *dst_local;
  Vec4 *src_local;
  
  rgb.m_data._8_8_ = dst;
  pfVar1 = tcu::Vector<float,_4>::operator[](src,0);
  fVar2 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)rgb.m_data._8_8_,0);
  x_ = Overlay(fVar2,*pfVar1);
  pfVar1 = tcu::Vector<float,_4>::operator[](src,1);
  fVar2 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)rgb.m_data._8_8_,1);
  y_ = Overlay(fVar2,*pfVar1);
  pfVar1 = tcu::Vector<float,_4>::operator[](src,2);
  fVar2 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)rgb.m_data._8_8_,2);
  fVar2 = Overlay(fVar2,*pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_30,x_,y_,fVar2,0.0);
  VVar3 = Blend(this,(Vec4 *)local_30,src,(Vec4 *)rgb.m_data._8_8_);
  return (Vec4)VVar3.m_data;
}

Assistant:

static tcu::Vec4 BlendOverlay(const tcu::Vec4& src, const tcu::Vec4& dst)
{
	tcu::Vec4 rgb(Overlay(src[0], dst[0]), Overlay(src[1], dst[1]), Overlay(src[2], dst[2]), 0.f);

	return Blend(rgb, src, dst);
}